

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Binasc.cpp
# Opt level: O2

int __thiscall
smf::Binasc::processMidiPitchBendWord(Binasc *this,ostream *out,string *word,int lineNum)

{
  byte bVar1;
  pointer pcVar2;
  ostream *poVar3;
  uint uVar4;
  double dVar5;
  double dVar6;
  
  if (1 < word->_M_string_length) {
    pcVar2 = (word->_M_dataplus)._M_p;
    bVar1 = pcVar2[1];
    if (((int)(char)bVar1 - 0x30U < 10) ||
       ((bVar1 < 0x2f && ((0x680000000000U >> ((ulong)bVar1 & 0x3f) & 1) != 0)))) {
      dVar5 = strtod(pcVar2 + 1,(char **)0x0);
      dVar6 = 1.0;
      if (dVar5 <= 1.0) {
        dVar6 = dVar5;
      }
      dVar5 = -1.0;
      if (-1.0 <= dVar6) {
        dVar5 = dVar6;
      }
      uVar4 = (uint)((dVar5 + 1.0) * 8191.5 + 0.5);
      poVar3 = std::operator<<(out,(byte)uVar4 & 0x7f);
      std::operator<<(poVar3,(byte)(uVar4 >> 7) & 0x7f);
      return 1;
    }
  }
  poVar3 = std::operator<<((ostream *)&std::cerr,"Error on line: ");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,lineNum);
  poVar3 = std::operator<<(poVar3,": \'p\' needs to be followed immediately by ");
  poVar3 = std::operator<<(poVar3,"a floating-point number");
  std::endl<char,std::char_traits<char>>(poVar3);
  return 0;
}

Assistant:

int Binasc::processMidiPitchBendWord(std::ostream& out, const std::string& word,
		int lineNum) {
	if (word.size() < 2) {
		std::cerr << "Error on line: " << lineNum
			  << ": 'p' needs to be followed immediately by "
			  << "a floating-point number" << std::endl;
		return 0;
	}
	if (!(isdigit(word[1]) || word[1] == '.' || word[1] == '-'
			|| word[1] == '+')) {
		std::cerr << "Error on line: " << lineNum
			  << ": 'p' needs to be followed immediately by "
			  << "a floating-point number" << std::endl;
		return 0;
	}
	double value = strtod(&word[1], NULL);

	if (value > 1.0) {
		value = 1.0;
	}
	if (value < -1.0) {
		value = -1.0;
	}

	int intval = (int)(((1 << 13)-0.5)  * (value + 1.0) + 0.5);
	uchar LSB = intval & 0x7f;
	uchar MSB = (intval >>  7) & 0x7f;
	out << LSB << MSB;
	return 1;
}